

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void SetAdditionalBindInfoForVariables(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Symbol *this;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Scope *pSVar1;
  bool bVar2;
  ParseNodeVar *pPVar3;
  Type *ppFVar4;
  Type pFVar5;
  
  pPVar3 = ParseNode::AsParseNodeVar(pnode);
  this = pPVar3->sym;
  if (this != (Symbol *)0x0) {
    this_00 = byteCodeGenerator->funcInfoStack;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == this_00) {
      pFVar5 = (Type)0x0;
    }
    else {
      ppFVar4 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this_00->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
      ;
      pFVar5 = *ppFVar4;
    }
    if ((this->field_0x42 & 8) == 0) {
      bVar2 = Symbol::IsArguments(this);
      if ((!bVar2) &&
         (((pSVar1 = this->scope, pSVar1 == pFVar5->bodyScope || (pSVar1 == pFVar5->paramScope)) ||
          ((*(ushort *)&pSVar1->field_0x44 & 0x16) == 4)))) {
        if ((*(uint *)&pFVar5->field_0xb4 & 4) == 0) {
          this->defCount = this->defCount + '\x01';
        }
        else {
          *(uint *)&pFVar5->field_0xb4 = *(uint *)&pFVar5->field_0xb4 | 0x40;
        }
      }
    }
    if ((this->field_0x44 & 1) != 0) {
      pPVar3 = ParseNode::AsParseNodeVar(pnode);
      Ident::TrySetIsUsedInLdElem(pPVar3->pnodeInit);
    }
    if (byteCodeGenerator->loopDepth != 0) {
      pPVar3 = ParseNode::AsParseNodeVar(pnode);
      if (pPVar3->pnodeInit != (ParseNodePtr)0x0) {
        this->field_0x43 = this->field_0x43 | 1;
      }
    }
  }
  return;
}

Assistant:

void SetAdditionalBindInfoForVariables(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Symbol *sym = pnode->AsParseNodeVar()->sym;
    if (sym == nullptr)
    {
        return;
    }

    FuncInfo* func = byteCodeGenerator->TopFuncInfo();
    if (!sym->GetIsGlobal() && !sym->IsArguments() &&
        (sym->GetScope() == func->GetBodyScope() || sym->GetScope() == func->GetParamScope() || sym->GetScope()->GetCanMerge()))
    {
        if (func->GetChildCallsEval())
        {
            func->SetHasLocalInClosure(true);
        }
        else
        {
            sym->RecordDef();
        }
    }
    if (sym->IsUsedInLdElem())
    {
        Ident::TrySetIsUsedInLdElem(pnode->AsParseNodeVar()->pnodeInit);
    }

    // If this decl does an assignment inside a loop body, then there's a chance
    // that a jitted loop body will expect us to begin with a valid value in this var.
    // So mark the sym as used so that we guarantee the var will at least get "undefined".
    if (byteCodeGenerator->IsInLoop() &&
        pnode->AsParseNodeVar()->pnodeInit)
    {
        sym->SetIsUsed(true);
    }
}